

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cpp
# Opt level: O2

bool __thiscall
xscript::parser::ast::parse_expression_statement
          (ast *this,
          unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>
          *parent)

{
  bool bVar1;
  unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_> *parent_00;
  string *this_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> args;
  initializer_list<xscript::tokenizer::token_t> __l;
  _Rb_tree<xscript::tokenizer::token_t,_xscript::tokenizer::token_t,_std::_Identity<xscript::tokenizer::token_t>,_std::less<xscript::tokenizer::token_t>,_std::allocator<xscript::tokenizer::token_t>_>
  local_98;
  string local_68;
  string local_48;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  less<xscript::tokenizer::token_t> local_13;
  allocator_type local_12;
  allocator<char> local_11;
  
  parent_00 = ast_node::add_child((parent->_M_t).
                                  super___uniq_ptr_impl<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_xscript::parser::ast_node_*,_std::default_delete<xscript::parser::ast_node>_>
                                  .super__Head_base<0UL,_xscript::parser::ast_node_*,_false>.
                                  _M_head_impl,EXPRESSION_STATEMENT);
  bVar1 = parse_expression(this,parent_00);
  if (bVar1) {
    if ((this->cur_token).type == TK_SEMICOLON) {
      next(this);
      return true;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"build_O2/src/CMakeFiles/xscript.dir/compiler_depend.ts",
               &local_11);
    local_28._M_len = 0x27;
    local_28._M_str = "\';\' expected after expression statement";
    args._M_len = 1;
    args._M_array = &local_28;
    append_syntax_error(this,&local_48,0x522,args);
    this_00 = &local_48;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"build_O2/src/CMakeFiles/xscript.dir/compiler_depend.ts",
               &local_11);
    local_28._M_len = CONCAT44(local_28._M_len._4_4_,0x37);
    __l._M_len = 1;
    __l._M_array = (iterator)&local_28;
    std::
    set<xscript::tokenizer::token_t,_std::less<xscript::tokenizer::token_t>,_std::allocator<xscript::tokenizer::token_t>_>
    ::set((set<xscript::tokenizer::token_t,_std::less<xscript::tokenizer::token_t>,_std::allocator<xscript::tokenizer::token_t>_>
           *)&local_98,__l,&local_13,&local_12);
    process_failover(this,&local_68,0x51e,
                     (set<xscript::tokenizer::token_t,_std::less<xscript::tokenizer::token_t>,_std::allocator<xscript::tokenizer::token_t>_>
                      *)&local_98,true);
    std::
    _Rb_tree<xscript::tokenizer::token_t,_xscript::tokenizer::token_t,_std::_Identity<xscript::tokenizer::token_t>,_std::less<xscript::tokenizer::token_t>,_std::allocator<xscript::tokenizer::token_t>_>
    ::~_Rb_tree(&local_98);
    this_00 = &local_68;
  }
  std::__cxx11::string::~string((string *)this_00);
  return false;
}

Assistant:

bool ast::parse_expression_statement(std::unique_ptr<ast_node>& parent) {
    std::unique_ptr<ast_node>& node = parent->add_child(EXPRESSION_STATEMENT);

    if (!parse_expression(node)) {
        return failover({tokenizer::TK_SEMICOLON});
    }

    if (cur_token != tokenizer::TK_SEMICOLON) {
        return syntax_error({"';' expected after expression statement"});
    }
    next();

    return true;
}